

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  double dVar1;
  double dVar2;
  int iVar3;
  double *x0;
  double *u0;
  double *ret;
  double *ptau_buf;
  long lVar4;
  FILE *__stream;
  FILE *__stream_00;
  int j;
  double local_c8;
  Cgmres<Model> controller;
  
  x0 = (double *)operator_new__(0x20);
  u0 = (double *)operator_new__(0x30);
  ret = (double *)operator_new__(0x20);
  ptau_buf = (double *)operator_new__(0x330);
  *x0 = 2.0;
  x0[1] = 2.0;
  x0[2] = 0.0;
  x0[3] = 0.0;
  *u0 = 0.0;
  u0[1] = 0.0;
  u0[2] = 10.0;
  u0[3] = 10.0;
  u0[4] = 0.0005;
  u0[5] = 0.0005;
  ret[2] = 0.0;
  ret[3] = 0.0;
  *ret = 0.0;
  ret[1] = 0.0;
  for (lVar4 = 0; lVar4 != 0x330; lVar4 = lVar4 + 0x10) {
    *(undefined8 *)((long)ptau_buf + lVar4) = 0x3ff0000000000000;
    ((undefined8 *)((long)ptau_buf + lVar4))[1] = 0xbff0000000000000;
  }
  Cgmres<Model>::Cgmres(&controller);
  Cgmres<Model>::set_ptau(&controller,ptau_buf);
  Cgmres<Model>::init_u0(&controller,u0);
  Cgmres<Model>::init_u0_newton(&controller,u0,x0,ptau_buf,10);
  __stream = fopen("mass_spring_damper_x.txt","w");
  __stream_00 = fopen("mass_spring_damper_u.txt","w");
  if (__stream_00 != (FILE *)0x0 && __stream != (FILE *)0x0) {
    local_c8 = 0.0;
    for (iVar3 = 0; iVar3 != 0x4e21; iVar3 = iVar3 + 1) {
      dVar1 = getEtime();
      Cgmres<Model>::control(&controller,u0,x0);
      dVar2 = getEtime();
      Simulator::dxdt(ret,x0,u0);
      mul(ret,ret,0.001,4);
      add(x0,x0,ret,4);
      fprintf(__stream,"%f");
      fprintf(__stream_00,"%f",SUB84((double)iVar3 * 0.001,0));
      for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
        fprintf(__stream,"\t%f",SUB84(x0[lVar4],0));
      }
      for (lVar4 = 0; lVar4 != 6; lVar4 = lVar4 + 1) {
        fprintf(__stream_00,"\t%f",SUB84(u0[lVar4],0));
      }
      local_c8 = local_c8 + (dVar2 - dVar1);
      fputc(10,__stream);
      fputc(10,__stream_00);
    }
    fclose(__stream);
    fclose(__stream_00);
    printf("Elapsed time = %f\n",SUB84(local_c8,0));
  }
  operator_delete__(x0);
  operator_delete__(u0);
  operator_delete__(ret);
  operator_delete__(ptau_buf);
  Cgmres<Model>::~Cgmres(&controller);
  return 0;
}

Assistant:

int main(void) {
  //---------------------------
  FILE* fp_x;
  FILE* fp_u;

  double t_start, t_end, t_all = 0;

  double* x;
  double* u;
  double* dxdt;
  double* pt;

  x = new double[Simulator::dim_x];
  u = new double[Simulator::dim_u];
  dxdt = new double[Simulator::dim_x];
  pt = new double[Simulator::dim_p * (Simulator::dv + 1)];

  // mass_spring_damper
  x[0] = 2.0;
  x[1] = 2.0;
  x[2] = 0.0;
  x[3] = 0.0;

  u[0] = 0.0;
  u[1] = 0.0;
  u[2] = 10.0;
  u[3] = 10.0;
  u[4] = 5e-4;
  u[5] = 5e-4;

  dxdt[0] = 0.0;
  dxdt[1] = 0.0;
  dxdt[2] = 0.0;
  dxdt[3] = 0.0;

  for (int i = 0; i < Simulator::dv + 1; i++) {
    pt[Simulator::dim_p * i + 0] = 1;
    pt[Simulator::dim_p * i + 1] = -1;
  }

  Cgmres<Model> controller;
  controller.set_ptau(pt);
  controller.init_u0(u);
  controller.init_u0_newton(u, x, pt, 10);

  fp_x = fopen("mass_spring_damper_x.txt", "w");
  fp_u = fopen("mass_spring_damper_u.txt", "w");

  if (NULL != fp_x && NULL != fp_u) {
    for (int i = 0; i <= (int)(Simulator::t_end / Simulator::dt); i++) {
      // Test code
      t_start = getEtime();
      controller.control(u, x);
      t_end = getEtime();
      t_all += (t_end - t_start);

      // x = x + dxdt * dt
      Simulator::dxdt(dxdt, x, u);
      mul(dxdt, dxdt, Simulator::dt, Simulator::dim_x);
      add(x, x, dxdt, Simulator::dim_x);

      fprintf(fp_x, "%f", Simulator::dt * i);
      fprintf(fp_u, "%f", Simulator::dt * i);
      for (int j = 0; j < Simulator::dim_x; j++) {
        fprintf(fp_x, "\t%f", x[j]);
      }
      for (int j = 0; j < Simulator::dim_u; j++) {
        fprintf(fp_u, "\t%f", u[j]);
      }
      fprintf(fp_x, "\n");
      fprintf(fp_u, "\n");
    }

    fclose(fp_x);
    fclose(fp_u);

    printf("Elapsed time = %f\n", t_all);
  }

  delete[] x;
  delete[] u;
  delete[] dxdt;
  delete[] pt;

  return 0;
}